

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate-a64.c
# Opt level: O1

void disas_simd_indexed(DisasContext_conflict1 *s,uint32_t insn)

{
  TCGContext_conflict1 *pTVar1;
  int iVar2;
  MemOp MVar3;
  uintptr_t o_27;
  TCGTemp *pTVar4;
  TCGTemp *pTVar5;
  uintptr_t uVar6;
  uint uVar7;
  int iVar8;
  TCGv_ptr pTVar9;
  uint uVar10;
  uint uVar11;
  TCGArg a3;
  uint uVar12;
  uint uVar13;
  uintptr_t o_18;
  TCGv_i32 pTVar14;
  ulong uVar15;
  uint uVar16;
  TCGOpcode opc;
  undefined4 in_register_00000034;
  TCGContext_conflict1 *pTVar17;
  undefined4 uVar18;
  undefined8 in_R8;
  undefined7 uVar19;
  undefined1 *a3_00;
  uint uVar20;
  undefined4 uVar21;
  undefined8 in_R10;
  code *pcVar22;
  uint element;
  uintptr_t o_4;
  long lVar24;
  uintptr_t uVar25;
  MemOp MVar26;
  uintptr_t o_1;
  undefined1 *puVar27;
  uint uVar28;
  uintptr_t o;
  uint srcidx;
  uintptr_t o_2;
  long lVar29;
  bool bVar30;
  _Bool _Var31;
  TCGTemp *local_f8;
  TCGTemp *local_f0;
  TCGTemp *local_e8;
  TCGTemp *local_e0;
  uintptr_t o_29;
  ulong local_c8;
  uintptr_t o_14;
  ulong local_b8;
  TCGTemp *local_b0;
  ulong local_a8;
  undefined8 local_a0;
  TCGTemp *local_98;
  undefined8 local_90;
  undefined8 local_88;
  TCGTemp *local_80;
  TCGv_ptr local_78;
  TCGv_i64 local_70;
  TCGTemp *local_68;
  TCGTemp *local_60;
  TCGv_i64 tcg_res [2];
  undefined7 uVar23;
  
  uVar11 = insn & 0x20000000;
  uVar28 = insn >> 0xc & 0xf;
  uVar12 = uVar11 >> 0x19;
  uVar13 = uVar12 | uVar28;
  if (0x1f < uVar13) goto switchD_006abc42_caseD_f;
  pTVar1 = s->uc->tcg_ctx;
  MVar26 = insn >> 0x16 & MO_64;
  iVar8 = 0;
  uVar23 = (undefined7)((ulong)in_R10 >> 8);
  uVar21 = (undefined4)CONCAT71(uVar23,1);
  uVar19 = (undefined7)((ulong)in_R8 >> 8);
  iVar2 = 0;
  switch(uVar13) {
  case 0:
  case 4:
  case 0x18:
  case 0x1c:
    if ((MVar26 != MO_32 || (insn & 0x10000000) != 0) ||
       ((s->isar->id_aa64isar0 & 0xf000000000000) == 0)) goto switchD_006abc42_caseD_f;
    MVar26 = MO_16;
    goto LAB_006abcef;
  case 1:
  case 5:
  case 9:
  case 0x19:
    iVar2 = 1;
    goto LAB_006abc7d;
  default:
    uVar21 = (undefined4)CONCAT71(uVar23,1);
    uVar18 = (undefined4)CONCAT71(uVar19,1);
    goto joined_r0x006abcc0;
  case 3:
  case 7:
  case 0xb:
    uVar21 = (undefined4)CONCAT71(uVar23,1);
    uVar18 = (undefined4)CONCAT71(uVar19,1);
    break;
  case 8:
  case 0x10:
  case 0x14:
    uVar18 = 0;
joined_r0x006abcc0:
    iVar8 = 0;
    if ((insn >> 0x1c & 1) != 0) goto switchD_006abc42_caseD_f;
    break;
  case 0xc:
  case 0xd:
    goto switchD_006abc42_caseD_c;
  case 0xe:
  case 0x1e:
    if ((MVar26 != MO_32 || (insn & 0x10000000) != 0) ||
       ((s->isar->id_aa64isar0 & 0xf00000000000) == 0)) goto switchD_006abc42_caseD_f;
    MVar26 = MO_32;
LAB_006abcef:
    iVar2 = 0;
switchD_006abc42_caseD_c:
    iVar8 = iVar2;
    uVar18 = 0;
    break;
  case 0xf:
  case 0x1b:
    goto switchD_006abc42_caseD_f;
  case 0x11:
  case 0x13:
  case 0x15:
  case 0x17:
    if (((insn >> 0x1c & 1) != 0) || ((s->isar->id_aa64isar1 & 0xf0000) == 0))
    goto switchD_006abc42_caseD_f;
    iVar2 = 2;
LAB_006abc7d:
    uVar21 = 0;
    goto switchD_006abc42_caseD_c;
  case 0x1d:
  case 0x1f:
    iVar8 = 0;
    uVar18 = 0;
    if ((s->isar->id_aa64isar0 & 0xf0000000) == 0) goto switchD_006abc42_caseD_f;
  }
  uVar20 = insn & 0x40000000;
  element = insn >> 0xb & 1;
  if (iVar8 == 2) {
    if ((short)MVar26 == 2) {
      MVar26 = MO_64;
      goto LAB_006abd94;
    }
    if ((MVar26 != MO_16) || (element != 0 && uVar20 == 0)) goto switchD_006abc42_caseD_f;
    MVar26 = MO_32;
LAB_006abd5a:
    _Var31 = true;
  }
  else {
    if (iVar8 == 1) {
      if (1 < MVar26 - MO_32) {
        if (MVar26 == MO_16) goto switchD_006abc42_caseD_f;
        MVar26 = MO_16;
        goto LAB_006abd5a;
      }
    }
    else if (((short)MVar26 == 3) || (MVar26 == MO_8)) goto switchD_006abc42_caseD_f;
LAB_006abd94:
    _Var31 = false;
  }
  if ((_Var31 != false) && ((s->isar->id_aa64pfr0 & 0xf0000) != 0x10000)) {
switchD_006abc42_caseD_f:
    unallocated_encoding_aarch64(s);
    return;
  }
  uVar10 = insn >> 0x15 & 1;
  uVar7 = insn >> 0x14 & 1;
  srcidx = insn >> 0x10 & 0xf;
  if (MVar26 == MO_64) {
    if (uVar20 == 0 || uVar10 != 0) goto switchD_006abc42_caseD_f;
LAB_006abe0a:
    srcidx = uVar7 << 4 | srcidx;
  }
  else {
    if (MVar26 == MO_32) {
      element = uVar10 + element * 2;
      goto LAB_006abe0a;
    }
    if (MVar26 != MO_16) {
      iVar8 = 0x343f;
LAB_006ad2fe:
      g_assertion_message_expr
                ("/workspace/llm4binary/github/license_c_cmakelists/AFLplusplus[P]unicornafl/unicorn/qemu/target/arm/translate-a64.c"
                 ,iVar8,(char *)0x0);
    }
    element = uVar10 * 2 + element * 4 | uVar7;
  }
  o_29 = CONCAT44(o_29._4_4_,uVar18);
  if (s->fp_access_checked == true) {
    __assert_fail("!s->fp_access_checked",
                  "/workspace/llm4binary/github/license_c_cmakelists/AFLplusplus[P]unicornafl/unicorn/qemu/target/arm/translate-a64.c"
                  ,0x487,"_Bool fp_access_check(DisasContext *)");
  }
  s->fp_access_checked = true;
  if (s->fp_excp_el != 0) {
    gen_exception_insn(s,s->pc_curr,1,0x1fe0000a,s->fp_excp_el);
    return;
  }
  local_a0 = (ulong)(insn >> 5);
  o_14 = CONCAT44(o_14._4_4_,uVar21);
  local_b8 = CONCAT44(in_register_00000034,insn);
  if ((char)uVar21 == '\0') {
    local_90 = CONCAT44(local_90._4_4_,insn) & 0xffffffff40000000;
    local_78 = get_fpstatus_ptr_aarch64(pTVar1,_Var31);
    uVar20 = (uint)local_90;
  }
  else {
    local_78 = (TCGv_ptr)0x0;
  }
  uVar7 = (uint)local_a0 & 0x1f;
  local_a0 = (ulong)uVar7;
  uVar16 = (uint)local_b8;
  uVar10 = uVar16 & 0x1f;
  local_a8 = (ulong)uVar10;
  if (uVar13 < 0x1f) {
    if ((0xaa0000U >> (uVar12 | uVar28) & 1) != 0) {
      pcVar22 = gen_helper_gvec_fcmlah_idx;
      if (MVar26 == MO_64) {
        pcVar22 = gen_helper_gvec_fcmlas_idx;
      }
      tcg_gen_gvec_3_ptr_aarch64
                (pTVar1,uVar10 * 0x100 + 0xc10,uVar7 * 0x100 + 0xc10,srcidx * 0x100 + 0xc10,local_78
                 ,(uint)(uVar20 != 0) * 8 + 8,s->sve_len,(uVar16 >> 0xd & 3) + element * 4,pcVar22);
      tcg_temp_free_internal_aarch64(pTVar1,(TCGTemp *)(local_78 + (long)pTVar1));
      return;
    }
    if ((0x11000011U >> (uVar12 | uVar28) & 1) != 0) {
      tcg_gen_gvec_3_ptr_aarch64
                (pTVar1,uVar10 * 0x100 + 0xc10,uVar7 * 0x100 + 0xc10,srcidx * 0x100 + 0xc10,
                 pTVar1->cpu_env,(uint)(uVar20 != 0) * 8 + 8,s->sve_len,
                 (uVar11 >> 0x1c) + element * 4 | uVar16 >> 0xe & 1,gen_helper_gvec_fmlal_idx_a64);
      return;
    }
    if ((0x40004000U >> (uVar12 | uVar28) & 1) != 0) {
      pcVar22 = gen_helper_gvec_udot_idx_b;
      if (uVar11 == 0) {
        pcVar22 = gen_helper_gvec_sdot_idx_b;
      }
      gen_gvec_op3_ool(s,uVar20 != 0,uVar10,uVar7,srcidx,element,pcVar22);
      return;
    }
  }
  if (MVar26 == MO_64) {
    pTVar4 = tcg_temp_new_internal_aarch64(pTVar1,TCG_TYPE_I64,false);
    if ((byte)((byte)o_14 | (byte)o_29 | uVar20 == 0) == 1) {
      __assert_fail("is_fp && is_q && !is_long",
                    "/workspace/llm4binary/github/license_c_cmakelists/AFLplusplus[P]unicornafl/unicorn/qemu/target/arm/translate-a64.c"
                    ,0x347a,"void disas_simd_indexed(DisasContext *, uint32_t)");
    }
    pTVar17 = s->uc->tcg_ctx;
    tcg_gen_op3_aarch64(pTVar17,INDEX_op_ld_i64,(long)pTVar17 + ((long)pTVar4 - (long)pTVar1),
                        (TCGArg)(pTVar17->cpu_env + (long)pTVar17),
                        (ulong)(srcidx * 0x100 + element * 8 + 0xc10));
    uVar11 = (uVar13 - 1) * 0x40000000 | uVar13 - 1 >> 2;
    o_29 = ((long)pTVar4 - (long)pTVar1) + (long)pTVar1;
    o_14 = (uintptr_t)(local_78 + (long)pTVar1);
    local_c8 = (ulong)((int)local_a8 * 0x100 + 0xc10);
    local_a0 = (ulong)(uint)((int)local_a0 << 8) + 0xc10;
    pTVar4 = (TCGTemp *)0x0;
    local_90 = (ulong)uVar11;
    do {
      pTVar5 = tcg_temp_new_internal_aarch64(pTVar1,TCG_TYPE_I64,false);
      lVar29 = (long)pTVar5 - (long)pTVar1;
      pTVar5 = tcg_temp_new_internal_aarch64(pTVar1,TCG_TYPE_I64,false);
      pTVar17 = s->uc->tcg_ctx;
      tcg_gen_op3_aarch64(pTVar17,INDEX_op_ld_i64,(long)pTVar17 + lVar29,
                          (TCGArg)(pTVar17->cpu_env + (long)pTVar17),
                          (long)&pTVar4->field_0x0 + local_a0);
      if (6 < uVar11) {
switchD_006ac19b_caseD_6ad2f2:
        iVar8 = 0x3494;
        goto LAB_006ad2fe;
      }
      lVar24 = (long)pTVar5 - (long)pTVar1;
      switch((long)&switchD_006ac19b::switchdataD_00d82de8 +
             (long)(int)(&switchD_006ac19b::switchdataD_00d82de8)[local_90]) {
      case 0x6ac19d:
        local_f8 = (TCGTemp *)((long)pTVar1 + lVar29);
        tcg_gen_callN_aarch64(pTVar1,helper_vfp_negd_aarch64,local_f8,1,&local_f8);
      case 0x6ac1bf:
        uVar15 = local_c8;
        pTVar17 = s->uc->tcg_ctx;
        local_80 = pTVar4;
        tcg_gen_op3_aarch64(pTVar17,INDEX_op_ld_i64,(long)pTVar17 + lVar24,
                            (TCGArg)(pTVar17->cpu_env + (long)pTVar17),
                            (long)&pTVar4->field_0x0 + local_c8);
        local_f8 = (TCGTemp *)((long)pTVar1 + lVar29);
        local_f0 = (TCGTemp *)o_29;
        local_e8 = (TCGTemp *)((long)pTVar1 + lVar24);
        local_e0 = (TCGTemp *)o_14;
        tcg_gen_callN_aarch64(pTVar1,helper_vfp_muladdd_aarch64,local_e8,4,&local_f8);
        pTVar5 = local_80;
        goto LAB_006ac2bf;
      case 0x6ac249:
        pcVar22 = helper_vfp_muld_aarch64;
        break;
      case 0x6ac276:
        pcVar22 = helper_vfp_mulxd_aarch64;
        break;
      case 0x6ad2f2:
        goto switchD_006ac19b_caseD_6ad2f2;
      }
      local_f8 = (TCGTemp *)((long)pTVar1 + lVar29);
      local_e8 = (TCGTemp *)o_14;
      local_f0 = (TCGTemp *)o_29;
      tcg_gen_callN_aarch64(pTVar1,pcVar22,(TCGTemp *)((long)pTVar1 + lVar24),3,&local_f8);
      pTVar5 = pTVar4;
      uVar15 = local_c8;
LAB_006ac2bf:
      pTVar17 = s->uc->tcg_ctx;
      tcg_gen_op3_aarch64(pTVar17,INDEX_op_st_i64,(long)pTVar17 + lVar24,
                          (TCGArg)(pTVar17->cpu_env + (long)pTVar17),
                          (TCGArg)(&pTVar5->field_0x0 + uVar15));
      tcg_temp_free_internal_aarch64(pTVar1,(TCGTemp *)(lVar29 + (long)pTVar1));
      tcg_temp_free_internal_aarch64(pTVar1,(TCGTemp *)(lVar24 + (long)pTVar1));
    } while ((((uint)local_b8 >> 0x1c & 1) == 0) &&
            (pTVar4 = (TCGTemp *)&pTVar5->val, pTVar5 == (TCGTemp *)0x0));
    _Var31 = ((uint)local_b8 >> 0x1c & 1) == 0;
    tcg_temp_free_internal_aarch64(pTVar1,(TCGTemp *)o_29);
  }
  else {
    if ((byte)o_29 != '\0') {
      local_90 = CONCAT44(local_90._4_4_,uVar16) & 0xffffffff20001000;
      if (MVar26 == MO_32) {
        MVar26 = (uint)((uVar16 & 0x20001000) != 0x20000000) * 4 + MO_32;
        local_80 = tcg_temp_new_internal_aarch64(pTVar1,TCG_TYPE_I64,false);
        local_70 = (TCGv_i64)((long)local_80 - (long)pTVar1);
        local_c8 = CONCAT44(local_c8._4_4_,MVar26);
        read_vec_element(s,local_70,srcidx,element,MVar26);
        uVar20 = uVar20 >> 0x1d;
        local_88 = CONCAT44(local_88._4_4_,(int)local_b8) & 0xffffffff0000e000;
        local_60 = (TCGTemp *)(ulong)((int)local_a8 * 0x100 + 0xc10);
        local_68 = (TCGTemp *)(ulong)(uVar28 - 2);
        lVar29 = 0;
        do {
          uVar15 = local_b8;
          pTVar4 = tcg_temp_new_internal_aarch64(pTVar1,TCG_TYPE_I64,false);
          local_90 = CONCAT44(local_90._4_4_,uVar20);
          if ((uVar15 & 0x10000000) != 0) {
            uVar20 = 0;
          }
          read_vec_element(s,(TCGv_i64)((long)pTVar4 - (long)pTVar1),(int)local_a0,uVar20,
                           (MemOp)local_c8);
          o_29 = (uintptr_t)tcg_temp_new_internal_aarch64(pTVar1,TCG_TYPE_I64,false);
          uVar25 = o_29 - (long)pTVar1;
          *(uintptr_t *)((long)tcg_res + lVar29) = uVar25;
          iVar8 = (MemOp)local_88;
          uVar6 = uVar25;
          if ((MemOp)local_88 != 0xa000) {
            pTVar5 = tcg_temp_new_internal_aarch64(pTVar1,TCG_TYPE_I64,false);
            uVar6 = (long)pTVar5 - (long)pTVar1;
          }
          pTVar5 = (TCGTemp *)((long)&pTVar1->pool_cur + uVar6);
          o_14 = uVar6;
          tcg_gen_op3_aarch64(pTVar1,INDEX_op_mul_i64,(TCGArg)pTVar5,(TCGArg)pTVar4,(TCGArg)local_80
                             );
          tcg_temp_free_internal_aarch64
                    (pTVar1,(TCGTemp *)((TCGv_i64)((long)pTVar4 - (long)pTVar1) + (long)pTVar1));
          if (((uint)local_b8 >> 0xc & 1) != 0) {
            local_f8 = (TCGTemp *)(pTVar1->cpu_env + (long)pTVar1);
            local_f0 = pTVar5;
            local_e8 = pTVar5;
            tcg_gen_callN_aarch64(pTVar1,helper_neon_addl_saturate_s64_aarch64,pTVar5,3,&local_f8);
          }
          uVar11 = (uint)local_b8;
          if (iVar8 != 0xa000) {
            pTVar1 = s->uc->tcg_ctx;
            tcg_gen_op3_aarch64(pTVar1,INDEX_op_ld_i64,(long)pTVar1 + uVar25,
                                (TCGArg)(pTVar1->cpu_env + (long)pTVar1),
                                (TCGArg)(&local_60->field_0x0 + lVar29));
            if ((uint)local_68 < 6) {
              (*(code *)(&DAT_00d82dd0 + *(int *)(&DAT_00d82dd0 + (long)local_68 * 4)))();
              return;
            }
            iVar8 = 0x3597;
            goto LAB_006ad2fe;
          }
          if ((uVar11 >> 0x1c & 1) != 0) break;
          uVar20 = (uint)local_90 + 1;
          bVar30 = lVar29 == 0;
          lVar29 = lVar29 + 8;
        } while (bVar30);
        tcg_temp_free_internal_aarch64
                  (pTVar1,(TCGTemp *)((long)&pTVar1->pool_cur + (long)&local_70->field_0x0));
        iVar8 = (int)local_a8;
        clear_vec_high(s,(uVar11 >> 0x1c & 1) == 0,iVar8);
LAB_006ad21e:
        if ((uVar11 >> 0x1c & 1) != 0) {
          tcg_res[1] = tcg_const_i64_aarch64(pTVar1,0);
        }
      }
      else {
        pTVar4 = tcg_temp_new_internal_aarch64(pTVar1,TCG_TYPE_I32,false);
        if (MVar26 != MO_16) {
          __assert_fail("size == 1",
                        "/workspace/llm4binary/github/license_c_cmakelists/AFLplusplus[P]unicornafl/unicorn/qemu/target/arm/translate-a64.c"
                        ,0x35a1,"void disas_simd_indexed(DisasContext *, uint32_t)");
        }
        pTVar14 = (TCGv_i32)((long)pTVar4 - (long)pTVar1);
        pTVar17 = s->uc->tcg_ctx;
        tcg_gen_op3_aarch64(pTVar17,INDEX_op_ld16u_i32,(TCGArg)((long)pTVar17 + (long)pTVar14),
                            (TCGArg)(pTVar17->cpu_env + (long)pTVar17),
                            (ulong)(srcidx * 0x100 + element * 2 + 0xc10));
        uVar15 = local_a8;
        uVar11 = (uint)local_b8;
        iVar8 = 1;
        if ((uVar11 >> 0x1c & 1) == 0) {
          tcg_gen_deposit_i32_aarch64(pTVar1,pTVar14,pTVar14,pTVar14,0x10,0x10);
          uVar11 = (uint)local_b8;
          iVar8 = 2;
        }
        uVar12 = (int)local_a0 * 0x100;
        puVar27 = (undefined1 *)(ulong)(uVar12 + 0xc10);
        local_a0 = CONCAT44(local_a0._4_4_,uVar11) & 0xffffffff0000e000;
        o_14 = (uintptr_t)(pTVar14 + (long)pTVar1);
        a3 = (TCGArg)((int)uVar15 * 0x100 + 0xc10);
        local_80 = (TCGTemp *)((ulong)(uVar11 >> 0x1b & 8 | uVar12) + 0xc10);
        local_c8 = (ulong)(uint)(iVar8 << 2);
        uVar15 = 0;
        local_88 = (ulong)(uVar28 - 2);
        do {
          pTVar4 = tcg_temp_new_internal_aarch64(pTVar1,TCG_TYPE_I32,false);
          if (((uint)local_b8 >> 0x1c & 1) == 0) {
            pTVar17 = s->uc->tcg_ctx;
            a3_00 = &local_80->field_0x0 + uVar15;
            pTVar9 = pTVar17->cpu_env + (long)pTVar17;
            opc = INDEX_op_ld_i32;
          }
          else {
            pTVar17 = s->uc->tcg_ctx;
            pTVar9 = pTVar17->cpu_env + (long)pTVar17;
            opc = INDEX_op_ld16u_i32;
            a3_00 = puVar27;
          }
          o_29 = (uintptr_t)puVar27;
          tcg_gen_op3_aarch64(pTVar17,opc,(long)pTVar17 + ((long)pTVar4 - (long)pTVar1),
                              (TCGArg)pTVar9,(TCGArg)a3_00);
          pTVar5 = tcg_temp_new_internal_aarch64(pTVar1,TCG_TYPE_I64,false);
          lVar24 = (long)pTVar5 - (long)pTVar1;
          *(long *)((long)tcg_res + uVar15 * 2) = lVar24;
          lVar29 = lVar24;
          if ((int)local_a0 != 0xa000) {
            pTVar5 = tcg_temp_new_internal_aarch64(pTVar1,TCG_TYPE_I64,false);
            lVar29 = (long)pTVar5 - (long)pTVar1;
          }
          pTVar4 = (TCGTemp *)(((long)pTVar4 - (long)pTVar1) + (long)pTVar1);
          pTVar5 = (TCGTemp *)((long)&pTVar1->pool_cur + lVar29);
          if ((uint)local_90 == 0x20000000) {
            pcVar22 = helper_neon_mull_u16_aarch64;
          }
          else {
            pcVar22 = helper_neon_mull_s16_aarch64;
          }
          local_f0 = (TCGTemp *)o_14;
          local_f8 = pTVar4;
          tcg_gen_callN_aarch64(pTVar1,pcVar22,pTVar5,2,&local_f8);
          if (((uint)local_b8 >> 0xc & 1) != 0) {
            local_f8 = (TCGTemp *)(pTVar1->cpu_env + (long)pTVar1);
            local_f0 = pTVar5;
            local_e8 = pTVar5;
            tcg_gen_callN_aarch64(pTVar1,helper_neon_addl_saturate_s32_aarch64,pTVar5,3,&local_f8);
          }
          tcg_temp_free_internal_aarch64(pTVar1,pTVar4);
          if ((int)local_a0 != 0xa000) {
            pTVar1 = s->uc->tcg_ctx;
            tcg_gen_op3_aarch64(pTVar1,INDEX_op_ld_i64,(long)pTVar1 + lVar24,
                                (TCGArg)(pTVar1->cpu_env + (long)pTVar1),a3);
            if ((uint)local_88 < 6) {
              (*(code *)(&DAT_00d82db8 + *(int *)(&DAT_00d82db8 + local_88 * 4)))();
              return;
            }
            iVar8 = 0x35e4;
            goto LAB_006ad2fe;
          }
          a3 = a3 + 8;
          puVar27 = (undefined1 *)(o_29 + 2);
          uVar15 = uVar15 + 4;
        } while (local_c8 != uVar15);
        tcg_temp_free_internal_aarch64(pTVar1,(TCGTemp *)o_14);
        uVar11 = (uint)local_b8;
        iVar8 = (int)local_a8;
        if ((uVar11 >> 0x1c & 1) != 0) {
          tcg_gen_ext32u_i64_aarch64(pTVar1,tcg_res[0],tcg_res[0]);
          goto LAB_006ad21e;
        }
      }
      lVar29 = 0;
      do {
        lVar24 = *(long *)((long)tcg_res + lVar29);
        pTVar17 = s->uc->tcg_ctx;
        tcg_gen_op3_aarch64(pTVar17,INDEX_op_st_i64,(long)&pTVar17->pool_cur + lVar24,
                            (TCGArg)(pTVar17->cpu_env + (long)pTVar17),
                            lVar29 + (ulong)(iVar8 * 0x100 + 0xc10));
        tcg_temp_free_internal_aarch64(pTVar1,(TCGTemp *)((long)&pTVar1->pool_cur + lVar24));
        lVar29 = lVar29 + 8;
      } while (lVar29 == 8);
      goto LAB_006ad299;
    }
    local_90 = CONCAT44(local_90._4_4_,uVar20);
    o_29 = (uintptr_t)(uVar20 != 0);
    o_14 = CONCAT44(o_14._4_4_,uVar16) & 0xffffffff10000000;
    pTVar4 = tcg_temp_new_internal_aarch64(pTVar1,TCG_TYPE_I32,false);
    pTVar14 = (TCGv_i32)((long)pTVar4 - (long)pTVar1);
    read_vec_element_i32(s,pTVar14,srcidx,element,MVar26);
    if (MVar26 == MO_16 && (int)o_14 == 0) {
      tcg_gen_deposit_i32_aarch64(pTVar1,pTVar14,pTVar14,pTVar14,0x10,0x10);
    }
    local_70 = (TCGv_i64)(o_29 * 2 + 2);
    MVar3 = MO_32;
    if ((local_b8 & 0x10000000) != 0) {
      MVar3 = MVar26;
    }
    local_88 = CONCAT44(local_88._4_4_,MVar3);
    local_b0 = (TCGTemp *)(pTVar14 + (long)pTVar1);
    local_98 = (TCGTemp *)(local_78 + (long)pTVar1);
    uVar15 = (ulong)((int)local_a8 * 0x100 + 0xc10);
    pTVar5 = (TCGTemp *)0x0;
    do {
      local_c8 = uVar15;
      local_60 = tcg_temp_new_internal_aarch64(pTVar1,TCG_TYPE_I32,false);
      pTVar14 = (TCGv_i32)((long)local_60 - (long)pTVar1);
      local_68 = tcg_temp_new_internal_aarch64(pTVar1,TCG_TYPE_I32,false);
      o_14 = (long)local_68 - (long)pTVar1;
      iVar8 = (int)pTVar5;
      o_29 = (uintptr_t)pTVar14;
      read_vec_element_i32(s,pTVar14,(int)local_a0,iVar8,(MemOp)local_88);
      pTVar14 = (TCGv_i32)o_14;
      iVar2 = (int)local_a8;
      local_80 = pTVar5;
      if (0x18 < uVar13) {
        if (uVar13 != 0x19) {
          if (uVar13 == 0x1d) {
            read_vec_element_i32(s,(TCGv_i32)o_14,iVar2,iVar8,(MemOp)local_88);
            local_f0 = (TCGTemp *)((long)&pTVar1->pool_cur + o_29);
            uVar15 = local_c8;
            if (MVar26 == MO_16) {
              local_f8 = (TCGTemp *)(pTVar1->cpu_env + (long)pTVar1);
              local_e8 = local_b0;
              local_e0 = (TCGTemp *)((long)&pTVar1->pool_cur + (long)pTVar14);
              pcVar22 = helper_neon_qrdmlah_s16_aarch64;
            }
            else {
              local_f8 = (TCGTemp *)(pTVar1->cpu_env + (long)pTVar1);
              local_e8 = local_b0;
              local_e0 = (TCGTemp *)((long)&pTVar1->pool_cur + (long)pTVar14);
              pcVar22 = helper_neon_qrdmlah_s32_aarch64;
            }
            goto LAB_006acd35;
          }
          if (uVar13 != 0x1f) goto switchD_006ac7d3_caseD_2;
          read_vec_element_i32(s,(TCGv_i32)o_14,iVar2,iVar8,(MemOp)local_88);
          local_f0 = (TCGTemp *)((long)&pTVar1->pool_cur + o_29);
          if (MVar26 == MO_16) {
            pTVar9 = pTVar1->cpu_env;
            pcVar22 = helper_neon_qrdmlsh_s16_aarch64;
          }
          else {
            pTVar9 = pTVar1->cpu_env;
            pcVar22 = helper_neon_qrdmlsh_s32_aarch64;
          }
          local_f8 = (TCGTemp *)(pTVar9 + (long)pTVar1);
          local_e8 = local_b0;
          local_e0 = (TCGTemp *)((long)&pTVar1->pool_cur + (long)pTVar14);
          iVar8 = 4;
          goto LAB_006accfa;
        }
        if (MVar26 == MO_32) {
          pcVar22 = helper_vfp_mulxs_aarch64;
        }
        else {
          if (MVar26 != MO_16) {
            iVar8 = 0x3516;
            goto LAB_006ad2fe;
          }
          if (((uint)local_b8 >> 0x1c & 1) == 0) {
            pcVar22 = helper_advsimd_mulx2h_aarch64;
          }
          else {
            pcVar22 = helper_advsimd_mulxh_aarch64;
          }
        }
LAB_006acda6:
        local_f8 = (TCGTemp *)((long)&pTVar1->pool_cur + o_29);
        local_e8 = local_98;
        local_f0 = local_b0;
        iVar8 = 3;
        uVar15 = local_c8;
        goto LAB_006acdab;
      }
      switch(uVar13) {
      case 1:
      case 5:
        read_vec_element_i32(s,(TCGv_i32)o_14,iVar2,iVar8,(MemOp)local_88);
        uVar15 = local_c8;
        if (MVar26 == MO_32) {
          if (uVar28 == 5) {
            tcg_gen_xori_i32_aarch64(pTVar1,(TCGv_i32)o_29,(TCGv_i32)o_29,-0x80000000);
          }
          local_f8 = (TCGTemp *)((long)&pTVar1->pool_cur + o_29);
          local_f0 = local_b0;
          local_e8 = (TCGTemp *)((long)&pTVar1->pool_cur + (long)pTVar14);
          local_e0 = local_98;
          pcVar22 = helper_vfp_muladds_aarch64;
        }
        else {
          if (MVar26 != MO_16) {
            iVar8 = 0x34f2;
            goto LAB_006ad2fe;
          }
          if (uVar28 == 5) {
            tcg_gen_xori_i32_aarch64(pTVar1,(TCGv_i32)o_29,(TCGv_i32)o_29,-0x7fff8000);
          }
          local_f8 = (TCGTemp *)((long)&pTVar1->pool_cur + o_29);
          local_e8 = (TCGTemp *)((long)&pTVar1->pool_cur + (long)pTVar14);
          if (((uint)local_b8 >> 0x1c & 1) == 0) {
            local_f0 = local_b0;
            local_e0 = local_98;
            pcVar22 = helper_advsimd_muladd2h_aarch64;
          }
          else {
            local_f0 = local_b0;
            local_e0 = local_98;
            pcVar22 = helper_advsimd_muladdh_aarch64;
          }
        }
LAB_006acd35:
        iVar8 = 4;
LAB_006acdab:
        tcg_gen_callN_aarch64
                  (pTVar1,pcVar22,(TCGTemp *)((long)&pTVar1->pool_cur + (long)pTVar14),iVar8,
                   &local_f8);
        goto LAB_006acdb9;
      default:
switchD_006ac7d3_caseD_2:
        iVar8 = 0x3542;
        goto LAB_006ad2fe;
      case 8:
      case 0x10:
      case 0x14:
        if (MVar26 == MO_16) {
          local_f8 = (TCGTemp *)((long)&pTVar1->pool_cur + o_29);
          local_f0 = local_b0;
          tcg_gen_callN_aarch64
                    (pTVar1,helper_neon_mul_u16_aarch64,(TCGTemp *)((long)&pTVar1->pool_cur + o_14),
                     2,&local_f8);
        }
        else {
          tcg_gen_op3_aarch64(pTVar1,INDEX_op_mul_i32,(TCGArg)local_68,(TCGArg)local_60,
                              (TCGArg)pTVar4);
        }
        uVar15 = local_c8;
        uVar6 = o_29;
        if (uVar28 != 8) {
          pTVar17 = s->uc->tcg_ctx;
          tcg_gen_op3_aarch64(pTVar17,INDEX_op_ld_i32,(long)&pTVar17->pool_cur + o_29,
                              (TCGArg)(pTVar17->cpu_env + (long)pTVar17),local_c8);
          pTVar14 = (TCGv_i32)o_14;
          (**(code **)((long)handle_shll::widenfns +
                      (ulong)(MVar26 << 4) + (ulong)(uVar28 == 4) * 8 + 0x10))
                    (pTVar1,o_14,uVar6,o_14);
        }
        goto LAB_006acdb9;
      case 9:
        if (MVar26 != MO_32) {
          if (MVar26 == MO_16) {
            if (((uint)local_b8 >> 0x1c & 1) == 0) {
              pcVar22 = helper_advsimd_mul2h_aarch64;
            }
            else {
              pcVar22 = helper_advsimd_mulh_aarch64;
            }
            goto LAB_006acda6;
          }
          iVar8 = 0x3504;
          goto LAB_006ad2fe;
        }
        local_f8 = (TCGTemp *)((long)&pTVar1->pool_cur + o_29);
        local_f0 = local_b0;
        local_e8 = local_98;
        pcVar22 = helper_vfp_muls_aarch64;
        break;
      case 0xc:
        local_f0 = (TCGTemp *)((long)&pTVar1->pool_cur + o_29);
        if (MVar26 == MO_16) {
          local_f8 = (TCGTemp *)(pTVar1->cpu_env + (long)pTVar1);
          local_e8 = local_b0;
          pcVar22 = helper_neon_qdmulh_s16_aarch64;
        }
        else {
          local_f8 = (TCGTemp *)(pTVar1->cpu_env + (long)pTVar1);
          local_e8 = local_b0;
          pcVar22 = helper_neon_qdmulh_s32_aarch64;
        }
        break;
      case 0xd:
        local_f0 = (TCGTemp *)((long)&pTVar1->pool_cur + o_29);
        if (MVar26 == MO_16) {
          local_f8 = (TCGTemp *)(pTVar1->cpu_env + (long)pTVar1);
          local_e8 = local_b0;
          pcVar22 = helper_neon_qrdmulh_s16_aarch64;
        }
        else {
          local_f8 = (TCGTemp *)(pTVar1->cpu_env + (long)pTVar1);
          local_e8 = local_b0;
          pcVar22 = helper_neon_qrdmulh_s32_aarch64;
        }
      }
      iVar8 = 3;
LAB_006accfa:
      tcg_gen_callN_aarch64
                (pTVar1,pcVar22,(TCGTemp *)((long)&pTVar1->pool_cur + (long)pTVar14),iVar8,&local_f8
                );
      uVar15 = local_c8;
LAB_006acdb9:
      if (((uint)local_b8 >> 0x1c & 1) == 0) {
        pTVar17 = s->uc->tcg_ctx;
        tcg_gen_op3_aarch64(pTVar17,INDEX_op_st_i32,(TCGArg)(pTVar14 + (long)&pTVar17->pool_cur),
                            (TCGArg)(pTVar17->cpu_env + (long)pTVar17),uVar15);
      }
      else {
        write_fp_sreg(s,(int)local_a8,pTVar14);
      }
      tcg_temp_free_internal_aarch64(pTVar1,(TCGTemp *)((long)&pTVar1->pool_cur + o_29));
      tcg_temp_free_internal_aarch64(pTVar1,(TCGTemp *)(pTVar14 + (long)pTVar1));
      if (((uint)local_b8 >> 0x1c & 1) != 0) break;
      pTVar5 = (TCGTemp *)&local_80->field_0x1;
      uVar15 = uVar15 + 4;
    } while (pTVar5 < local_70);
    _Var31 = (uint)local_90 != 0;
    tcg_temp_free_internal_aarch64(pTVar1,local_b0);
  }
  clear_vec_high(s,_Var31,(int)local_a8);
LAB_006ad299:
  if (local_78 != (TCGv_ptr)0x0) {
    tcg_temp_free_internal_aarch64(pTVar1,(TCGTemp *)(local_78 + (long)pTVar1));
  }
  return;
}

Assistant:

static void disas_simd_indexed(DisasContext *s, uint32_t insn)
{
    TCGContext *tcg_ctx = s->uc->tcg_ctx;
    /* This encoding has two kinds of instruction:
     *  normal, where we perform elt x idxelt => elt for each
     *     element in the vector
     *  long, where we perform elt x idxelt and generate a result of
     *     double the width of the input element
     * The long ops have a 'part' specifier (ie come in INSN, INSN2 pairs).
     */
    bool is_scalar = extract32(insn, 28, 1);
    bool is_q = extract32(insn, 30, 1);
    bool u = extract32(insn, 29, 1);
    int size = extract32(insn, 22, 2);
    int l = extract32(insn, 21, 1);
    int m = extract32(insn, 20, 1);
    /* Note that the Rm field here is only 4 bits, not 5 as it usually is */
    int rm = extract32(insn, 16, 4);
    int opcode = extract32(insn, 12, 4);
    int h = extract32(insn, 11, 1);
    int rn = extract32(insn, 5, 5);
    int rd = extract32(insn, 0, 5);
    bool is_long = false;
    int is_fp = 0;
    bool is_fp16 = false;
    int index;
    TCGv_ptr fpst;

    switch (16 * u + opcode) {
    case 0x08: /* MUL */
    case 0x10: /* MLA */
    case 0x14: /* MLS */
        if (is_scalar) {
            unallocated_encoding(s);
            return;
        }
        break;
    case 0x02: /* SMLAL, SMLAL2 */
    case 0x12: /* UMLAL, UMLAL2 */
    case 0x06: /* SMLSL, SMLSL2 */
    case 0x16: /* UMLSL, UMLSL2 */
    case 0x0a: /* SMULL, SMULL2 */
    case 0x1a: /* UMULL, UMULL2 */
        if (is_scalar) {
            unallocated_encoding(s);
            return;
        }
        is_long = true;
        break;
    case 0x03: /* SQDMLAL, SQDMLAL2 */
    case 0x07: /* SQDMLSL, SQDMLSL2 */
    case 0x0b: /* SQDMULL, SQDMULL2 */
        is_long = true;
        break;
    case 0x0c: /* SQDMULH */
    case 0x0d: /* SQRDMULH */
        break;
    case 0x01: /* FMLA */
    case 0x05: /* FMLS */
    case 0x09: /* FMUL */
    case 0x19: /* FMULX */
        is_fp = 1;
        break;
    case 0x1d: /* SQRDMLAH */
    case 0x1f: /* SQRDMLSH */
        if (!dc_isar_feature(aa64_rdm, s)) {
            unallocated_encoding(s);
            return;
        }
        break;
    case 0x0e: /* SDOT */
    case 0x1e: /* UDOT */
        if (is_scalar || size != MO_32 || !dc_isar_feature(aa64_dp, s)) {
            unallocated_encoding(s);
            return;
        }
        break;
    case 0x11: /* FCMLA #0 */
    case 0x13: /* FCMLA #90 */
    case 0x15: /* FCMLA #180 */
    case 0x17: /* FCMLA #270 */
        if (is_scalar || !dc_isar_feature(aa64_fcma, s)) {
            unallocated_encoding(s);
            return;
        }
        is_fp = 2;
        break;
    case 0x00: /* FMLAL */
    case 0x04: /* FMLSL */
    case 0x18: /* FMLAL2 */
    case 0x1c: /* FMLSL2 */
        if (is_scalar || size != MO_32 || !dc_isar_feature(aa64_fhm, s)) {
            unallocated_encoding(s);
            return;
        }
        size = MO_16;
        /* is_fp, but we pass tcg_ctx->cpu_env not fp_status.  */
        break;
    default:
        unallocated_encoding(s);
        return;
    }

    switch (is_fp) {
    case 1: /* normal fp */
        /* convert insn encoded size to MemOp size */
        switch (size) {
        case 0: /* half-precision */
            size = MO_16;
            is_fp16 = true;
            break;
        case MO_32: /* single precision */
        case MO_64: /* double precision */
            break;
        default:
            unallocated_encoding(s);
            return;
        }
        break;

    case 2: /* complex fp */
        /* Each indexable element is a complex pair.  */
        size += 1;
        switch (size) {
        case MO_32:
            if (h && !is_q) {
                unallocated_encoding(s);
                return;
            }
            is_fp16 = true;
            break;
        case MO_64:
            break;
        default:
            unallocated_encoding(s);
            return;
        }
        break;

    default: /* integer */
        switch (size) {
        case MO_8:
        case MO_64:
            unallocated_encoding(s);
            return;
        }
        break;
    }
    if (is_fp16 && !dc_isar_feature(aa64_fp16, s)) {
        unallocated_encoding(s);
        return;
    }

    /* Given MemOp size, adjust register and indexing.  */
    switch (size) {
    case MO_16:
        index = h << 2 | l << 1 | m;
        break;
    case MO_32:
        index = h << 1 | l;
        rm |= m << 4;
        break;
    case MO_64:
        if (l || !is_q) {
            unallocated_encoding(s);
            return;
        }
        index = h;
        rm |= m << 4;
        break;
    default:
        g_assert_not_reached();
    }

    if (!fp_access_check(s)) {
        return;
    }

    if (is_fp) {
        fpst = get_fpstatus_ptr(tcg_ctx, is_fp16);
    } else {
        fpst = NULL;
    }

    switch (16 * u + opcode) {
    case 0x0e: /* SDOT */
    case 0x1e: /* UDOT */
        gen_gvec_op3_ool(s, is_q, rd, rn, rm, index,
                         u ? gen_helper_gvec_udot_idx_b
                         : gen_helper_gvec_sdot_idx_b);
        return;
    case 0x11: /* FCMLA #0 */
    case 0x13: /* FCMLA #90 */
    case 0x15: /* FCMLA #180 */
    case 0x17: /* FCMLA #270 */
        {
            int rot = extract32(insn, 13, 2);
            int data = (index << 2) | rot;
            tcg_gen_gvec_3_ptr(tcg_ctx, vec_full_reg_offset(s, rd),
                               vec_full_reg_offset(s, rn),
                               vec_full_reg_offset(s, rm), fpst,
                               is_q ? 16 : 8, vec_full_reg_size(s), data,
                               size == MO_64
                               ? gen_helper_gvec_fcmlas_idx
                               : gen_helper_gvec_fcmlah_idx);
            tcg_temp_free_ptr(tcg_ctx, fpst);
        }
        return;

    case 0x00: /* FMLAL */
    case 0x04: /* FMLSL */
    case 0x18: /* FMLAL2 */
    case 0x1c: /* FMLSL2 */
        {
            int is_s = extract32(opcode, 2, 1);
            int is_2 = u;
            int data = (index << 2) | (is_2 << 1) | is_s;
            tcg_gen_gvec_3_ptr(tcg_ctx, vec_full_reg_offset(s, rd),
                               vec_full_reg_offset(s, rn),
                               vec_full_reg_offset(s, rm), tcg_ctx->cpu_env,
                               is_q ? 16 : 8, vec_full_reg_size(s),
                               data, gen_helper_gvec_fmlal_idx_a64);
        }
        return;
    }

    if (size == 3) {
        TCGv_i64 tcg_idx = tcg_temp_new_i64(tcg_ctx);
        int pass;

        assert(is_fp && is_q && !is_long);

        read_vec_element(s, tcg_idx, rm, index, MO_64);

        for (pass = 0; pass < (is_scalar ? 1 : 2); pass++) {
            TCGv_i64 tcg_op = tcg_temp_new_i64(tcg_ctx);
            TCGv_i64 tcg_res = tcg_temp_new_i64(tcg_ctx);

            read_vec_element(s, tcg_op, rn, pass, MO_64);

            switch (16 * u + opcode) {
            case 0x05: /* FMLS */
                /* As usual for ARM, separate negation for fused multiply-add */
                gen_helper_vfp_negd(tcg_ctx, tcg_op, tcg_op);
                /* fall through */
            case 0x01: /* FMLA */
                read_vec_element(s, tcg_res, rd, pass, MO_64);
                gen_helper_vfp_muladdd(tcg_ctx, tcg_res, tcg_op, tcg_idx, tcg_res, fpst);
                break;
            case 0x09: /* FMUL */
                gen_helper_vfp_muld(tcg_ctx, tcg_res, tcg_op, tcg_idx, fpst);
                break;
            case 0x19: /* FMULX */
                gen_helper_vfp_mulxd(tcg_ctx, tcg_res, tcg_op, tcg_idx, fpst);
                break;
            default:
                g_assert_not_reached();
            }

            write_vec_element(s, tcg_res, rd, pass, MO_64);
            tcg_temp_free_i64(tcg_ctx, tcg_op);
            tcg_temp_free_i64(tcg_ctx, tcg_res);
        }

        tcg_temp_free_i64(tcg_ctx, tcg_idx);
        clear_vec_high(s, !is_scalar, rd);
    } else if (!is_long) {
        /* 32 bit floating point, or 16 or 32 bit integer.
         * For the 16 bit scalar case we use the usual Neon helpers and
         * rely on the fact that 0 op 0 == 0 with no side effects.
         */
        TCGv_i32 tcg_idx = tcg_temp_new_i32(tcg_ctx);
        int pass, maxpasses;

        if (is_scalar) {
            maxpasses = 1;
        } else {
            maxpasses = is_q ? 4 : 2;
        }

        read_vec_element_i32(s, tcg_idx, rm, index, size);

        if (size == 1 && !is_scalar) {
            /* The simplest way to handle the 16x16 indexed ops is to duplicate
             * the index into both halves of the 32 bit tcg_idx and then use
             * the usual Neon helpers.
             */
            tcg_gen_deposit_i32(tcg_ctx, tcg_idx, tcg_idx, tcg_idx, 16, 16);
        }

        for (pass = 0; pass < maxpasses; pass++) {
            TCGv_i32 tcg_op = tcg_temp_new_i32(tcg_ctx);
            TCGv_i32 tcg_res = tcg_temp_new_i32(tcg_ctx);

            read_vec_element_i32(s, tcg_op, rn, pass, is_scalar ? size : MO_32);

            switch (16 * u + opcode) {
            case 0x08: /* MUL */
            case 0x10: /* MLA */
            case 0x14: /* MLS */
            {
                static NeonGenTwoOpFn * const fns[2][2] = {
                    { gen_helper_neon_add_u16, gen_helper_neon_sub_u16 },
                    { tcg_gen_add_i32, tcg_gen_sub_i32 },
                };
                NeonGenTwoOpFn *genfn;
                bool is_sub = opcode == 0x4;

                if (size == 1) {
                    gen_helper_neon_mul_u16(tcg_ctx, tcg_res, tcg_op, tcg_idx);
                } else {
                    tcg_gen_mul_i32(tcg_ctx, tcg_res, tcg_op, tcg_idx);
                }
                if (opcode == 0x8) {
                    break;
                }
                read_vec_element_i32(s, tcg_op, rd, pass, MO_32);
                genfn = fns[size - 1][is_sub];
                genfn(tcg_ctx, tcg_res, tcg_op, tcg_res);
                break;
            }
            case 0x05: /* FMLS */
            case 0x01: /* FMLA */
                read_vec_element_i32(s, tcg_res, rd, pass,
                                     is_scalar ? size : MO_32);
                switch (size) {
                case 1:
                    if (opcode == 0x5) {
                        /* As usual for ARM, separate negation for fused
                         * multiply-add */
                        tcg_gen_xori_i32(tcg_ctx, tcg_op, tcg_op, 0x80008000);
                    }
                    if (is_scalar) {
                        gen_helper_advsimd_muladdh(tcg_ctx, tcg_res, tcg_op, tcg_idx,
                                                   tcg_res, fpst);
                    } else {
                        gen_helper_advsimd_muladd2h(tcg_ctx, tcg_res, tcg_op, tcg_idx,
                                                    tcg_res, fpst);
                    }
                    break;
                case 2:
                    if (opcode == 0x5) {
                        /* As usual for ARM, separate negation for
                         * fused multiply-add */
                        tcg_gen_xori_i32(tcg_ctx, tcg_op, tcg_op, 0x80000000);
                    }
                    gen_helper_vfp_muladds(tcg_ctx, tcg_res, tcg_op, tcg_idx,
                                           tcg_res, fpst);
                    break;
                default:
                    g_assert_not_reached();
                }
                break;
            case 0x09: /* FMUL */
                switch (size) {
                case 1:
                    if (is_scalar) {
                        gen_helper_advsimd_mulh(tcg_ctx, tcg_res, tcg_op,
                                                tcg_idx, fpst);
                    } else {
                        gen_helper_advsimd_mul2h(tcg_ctx, tcg_res, tcg_op,
                                                 tcg_idx, fpst);
                    }
                    break;
                case 2:
                    gen_helper_vfp_muls(tcg_ctx, tcg_res, tcg_op, tcg_idx, fpst);
                    break;
                default:
                    g_assert_not_reached();
                }
                break;
            case 0x19: /* FMULX */
                switch (size) {
                case 1:
                    if (is_scalar) {
                        gen_helper_advsimd_mulxh(tcg_ctx, tcg_res, tcg_op,
                                                 tcg_idx, fpst);
                    } else {
                        gen_helper_advsimd_mulx2h(tcg_ctx, tcg_res, tcg_op,
                                                  tcg_idx, fpst);
                    }
                    break;
                case 2:
                    gen_helper_vfp_mulxs(tcg_ctx, tcg_res, tcg_op, tcg_idx, fpst);
                    break;
                default:
                    g_assert_not_reached();
                }
                break;
            case 0x0c: /* SQDMULH */
                if (size == 1) {
                    gen_helper_neon_qdmulh_s16(tcg_ctx, tcg_res, tcg_ctx->cpu_env,
                                               tcg_op, tcg_idx);
                } else {
                    gen_helper_neon_qdmulh_s32(tcg_ctx, tcg_res, tcg_ctx->cpu_env,
                                               tcg_op, tcg_idx);
                }
                break;
            case 0x0d: /* SQRDMULH */
                if (size == 1) {
                    gen_helper_neon_qrdmulh_s16(tcg_ctx, tcg_res, tcg_ctx->cpu_env,
                                                tcg_op, tcg_idx);
                } else {
                    gen_helper_neon_qrdmulh_s32(tcg_ctx, tcg_res, tcg_ctx->cpu_env,
                                                tcg_op, tcg_idx);
                }
                break;
            case 0x1d: /* SQRDMLAH */
                read_vec_element_i32(s, tcg_res, rd, pass,
                                     is_scalar ? size : MO_32);
                if (size == 1) {
                    gen_helper_neon_qrdmlah_s16(tcg_ctx, tcg_res, tcg_ctx->cpu_env,
                                                tcg_op, tcg_idx, tcg_res);
                } else {
                    gen_helper_neon_qrdmlah_s32(tcg_ctx, tcg_res, tcg_ctx->cpu_env,
                                                tcg_op, tcg_idx, tcg_res);
                }
                break;
            case 0x1f: /* SQRDMLSH */
                read_vec_element_i32(s, tcg_res, rd, pass,
                                     is_scalar ? size : MO_32);
                if (size == 1) {
                    gen_helper_neon_qrdmlsh_s16(tcg_ctx, tcg_res, tcg_ctx->cpu_env,
                                                tcg_op, tcg_idx, tcg_res);
                } else {
                    gen_helper_neon_qrdmlsh_s32(tcg_ctx, tcg_res, tcg_ctx->cpu_env,
                                                tcg_op, tcg_idx, tcg_res);
                }
                break;
            default:
                g_assert_not_reached();
            }

            if (is_scalar) {
                write_fp_sreg(s, rd, tcg_res);
            } else {
                write_vec_element_i32(s, tcg_res, rd, pass, MO_32);
            }

            tcg_temp_free_i32(tcg_ctx, tcg_op);
            tcg_temp_free_i32(tcg_ctx, tcg_res);
        }

        tcg_temp_free_i32(tcg_ctx, tcg_idx);
        clear_vec_high(s, is_q, rd);
    } else {
        /* long ops: 16x16->32 or 32x32->64 */
        TCGv_i64 tcg_res[2];
        int pass;
        bool satop = extract32(opcode, 0, 1);
        MemOp memop = MO_32;

        if (satop || !u) {
            memop |= MO_SIGN;
        }

        if (size == 2) {
            TCGv_i64 tcg_idx = tcg_temp_new_i64(tcg_ctx);

            read_vec_element(s, tcg_idx, rm, index, memop);

            for (pass = 0; pass < (is_scalar ? 1 : 2); pass++) {
                TCGv_i64 tcg_op = tcg_temp_new_i64(tcg_ctx);
                TCGv_i64 tcg_passres;
                int passelt;

                if (is_scalar) {
                    passelt = 0;
                } else {
                    passelt = pass + (is_q * 2);
                }

                read_vec_element(s, tcg_op, rn, passelt, memop);

                tcg_res[pass] = tcg_temp_new_i64(tcg_ctx);

                if (opcode == 0xa || opcode == 0xb) {
                    /* Non-accumulating ops */
                    tcg_passres = tcg_res[pass];
                } else {
                    tcg_passres = tcg_temp_new_i64(tcg_ctx);
                }

                tcg_gen_mul_i64(tcg_ctx, tcg_passres, tcg_op, tcg_idx);
                tcg_temp_free_i64(tcg_ctx, tcg_op);

                if (satop) {
                    /* saturating, doubling */
                    gen_helper_neon_addl_saturate_s64(tcg_ctx, tcg_passres, tcg_ctx->cpu_env,
                                                      tcg_passres, tcg_passres);
                }

                if (opcode == 0xa || opcode == 0xb) {
                    continue;
                }

                /* Accumulating op: handle accumulate step */
                read_vec_element(s, tcg_res[pass], rd, pass, MO_64);

                switch (opcode) {
                case 0x2: /* SMLAL, SMLAL2, UMLAL, UMLAL2 */
                    tcg_gen_add_i64(tcg_ctx, tcg_res[pass], tcg_res[pass], tcg_passres);
                    break;
                case 0x6: /* SMLSL, SMLSL2, UMLSL, UMLSL2 */
                    tcg_gen_sub_i64(tcg_ctx, tcg_res[pass], tcg_res[pass], tcg_passres);
                    break;
                case 0x7: /* SQDMLSL, SQDMLSL2 */
                    tcg_gen_neg_i64(tcg_ctx, tcg_passres, tcg_passres);
                    /* fall through */
                case 0x3: /* SQDMLAL, SQDMLAL2 */
                    gen_helper_neon_addl_saturate_s64(tcg_ctx, tcg_res[pass], tcg_ctx->cpu_env,
                                                      tcg_res[pass],
                                                      tcg_passres);
                    break;
                default:
                    g_assert_not_reached();
                }
                tcg_temp_free_i64(tcg_ctx, tcg_passres);
            }
            tcg_temp_free_i64(tcg_ctx, tcg_idx);

            clear_vec_high(s, !is_scalar, rd);
        } else {
            TCGv_i32 tcg_idx = tcg_temp_new_i32(tcg_ctx);

            assert(size == 1);
            read_vec_element_i32(s, tcg_idx, rm, index, size);

            if (!is_scalar) {
                /* The simplest way to handle the 16x16 indexed ops is to
                 * duplicate the index into both halves of the 32 bit tcg_idx
                 * and then use the usual Neon helpers.
                 */
                tcg_gen_deposit_i32(tcg_ctx, tcg_idx, tcg_idx, tcg_idx, 16, 16);
            }

            for (pass = 0; pass < (is_scalar ? 1 : 2); pass++) {
                TCGv_i32 tcg_op = tcg_temp_new_i32(tcg_ctx);
                TCGv_i64 tcg_passres;

                if (is_scalar) {
                    read_vec_element_i32(s, tcg_op, rn, pass, size);
                } else {
                    read_vec_element_i32(s, tcg_op, rn,
                                         pass + (is_q * 2), MO_32);
                }

                tcg_res[pass] = tcg_temp_new_i64(tcg_ctx);

                if (opcode == 0xa || opcode == 0xb) {
                    /* Non-accumulating ops */
                    tcg_passres = tcg_res[pass];
                } else {
                    tcg_passres = tcg_temp_new_i64(tcg_ctx);
                }

                if (memop & MO_SIGN) {
                    gen_helper_neon_mull_s16(tcg_ctx, tcg_passres, tcg_op, tcg_idx);
                } else {
                    gen_helper_neon_mull_u16(tcg_ctx, tcg_passres, tcg_op, tcg_idx);
                }
                if (satop) {
                    gen_helper_neon_addl_saturate_s32(tcg_ctx, tcg_passres, tcg_ctx->cpu_env,
                                                      tcg_passres, tcg_passres);
                }
                tcg_temp_free_i32(tcg_ctx, tcg_op);

                if (opcode == 0xa || opcode == 0xb) {
                    continue;
                }

                /* Accumulating op: handle accumulate step */
                read_vec_element(s, tcg_res[pass], rd, pass, MO_64);

                switch (opcode) {
                case 0x2: /* SMLAL, SMLAL2, UMLAL, UMLAL2 */
                    gen_helper_neon_addl_u32(tcg_ctx, tcg_res[pass], tcg_res[pass],
                                             tcg_passres);
                    break;
                case 0x6: /* SMLSL, SMLSL2, UMLSL, UMLSL2 */
                    gen_helper_neon_subl_u32(tcg_ctx, tcg_res[pass], tcg_res[pass],
                                             tcg_passres);
                    break;
                case 0x7: /* SQDMLSL, SQDMLSL2 */
                    gen_helper_neon_negl_u32(tcg_ctx, tcg_passres, tcg_passres);
                    /* fall through */
                case 0x3: /* SQDMLAL, SQDMLAL2 */
                    gen_helper_neon_addl_saturate_s32(tcg_ctx, tcg_res[pass], tcg_ctx->cpu_env,
                                                      tcg_res[pass],
                                                      tcg_passres);
                    break;
                default:
                    g_assert_not_reached();
                }
                tcg_temp_free_i64(tcg_ctx, tcg_passres);
            }
            tcg_temp_free_i32(tcg_ctx, tcg_idx);

            if (is_scalar) {
                tcg_gen_ext32u_i64(tcg_ctx, tcg_res[0], tcg_res[0]);
            }
        }

        if (is_scalar) {
            tcg_res[1] = tcg_const_i64(tcg_ctx, 0);
        }

        for (pass = 0; pass < 2; pass++) {
            write_vec_element(s, tcg_res[pass], rd, pass, MO_64);
            tcg_temp_free_i64(tcg_ctx, tcg_res[pass]);
        }
    }

    if (fpst) {
        tcg_temp_free_ptr(tcg_ctx, fpst);
    }
}